

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

PathPtr __thiscall kj::PathPtr::parent(PathPtr *this)

{
  size_t sVar1;
  ArrayPtr<const_kj::String> parts;
  Fault local_28;
  Fault f;
  PathPtr *this_local;
  
  f.exception = (Exception *)this;
  sVar1 = ArrayPtr<const_kj::String>::size(&this->parts);
  if (sVar1 != 0) {
    sVar1 = ArrayPtr<const_kj::String>::size(&this->parts);
    parts = ArrayPtr<const_kj::String>::slice(&this->parts,0,sVar1 - 1);
    PathPtr((PathPtr *)&this_local,parts);
    return (PathPtr)_this_local;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x7b,FAILED,"parts.size() > 0","\"root path has no parent\"",
             (char (*) [24])"root path has no parent");
  _::Debug::Fault::fatal(&local_28);
}

Assistant:

PathPtr PathPtr::parent() const {
  KJ_REQUIRE(parts.size() > 0, "root path has no parent");
  return PathPtr(parts.slice(0, parts.size() - 1));
}